

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O3

void TestPolyGraphDense<double>(Polynomial<double> *poly_graph)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  bool bVar7;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  size_t __i;
  long lVar9;
  char *pcVar10;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  Spins spins;
  Binaries binaries;
  random_device rnd;
  mt19937 mt;
  undefined1 local_2878 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2870;
  pointer local_2868;
  Binaries local_2858;
  AssertHelper local_2840;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2838;
  internal local_2830 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2828;
  int local_281c;
  int local_2818;
  int local_2814;
  int local_2810;
  int local_280c;
  int local_2808;
  int local_2804;
  int local_2800;
  int local_27fc;
  int local_27f8;
  int local_27f4;
  int local_27f0;
  Type local_27ec;
  int local_27e8;
  Type local_27e4;
  Type local_27e0;
  int local_27dc;
  int local_27d8;
  Type local_27d4;
  double local_27d0;
  Polynomial<double> *local_27c8;
  double local_27c0;
  double local_27b8;
  double local_27b0;
  double local_27a8;
  double local_27a0;
  double local_2798;
  double local_2790;
  double local_2788;
  double local_2780;
  double local_2778;
  double local_2770;
  double local_2768;
  double local_2760;
  double local_2758;
  double local_2750;
  undefined1 local_2748 [16];
  undefined1 local_2738 [4992];
  undefined1 local_13b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_13b0;
  pointer local_13a8;
  size_t local_38;
  
  local_13b8 = (undefined1  [8])(poly_graph->super_Graph)._num_spins;
  local_2878._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2748,"poly_graph.size()","3",(unsigned_long *)local_13b8,
             (int *)local_2878);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xcc,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  local_13b8 = (undefined1  [8])
               (((long)(poly_graph->poly_key_list_).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(poly_graph->poly_key_list_).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_2878._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2748,"poly_graph.get_num_interactions()","8",
             (unsigned_long *)local_13b8,(int *)local_2878);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xcd,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  local_13b8 = (undefined1  [8])
               ((long)(poly_graph->poly_value_list_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(poly_graph->poly_value_list_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_2878._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2748,"poly_graph.get_values().size()","8",(unsigned_long *)local_13b8
             ,(int *)local_2878);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xce,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  local_13b8 = (undefined1  [8])
               (((long)(poly_graph->poly_key_list_).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(poly_graph->poly_key_list_).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_2878._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2748,"poly_graph.get_keys().size()","8",(unsigned_long *)local_13b8,
             (int *)local_2878);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xcf,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  local_2748._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_2748._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2738._0_8_ = (pointer)0x0;
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {} )","+0.1",dVar6,0.1);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd1,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2748._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {0} )","-0.5",dVar6,-0.5);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd2,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_00,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {1} )","+1.0",dVar6,1.0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_2748._0_8_ !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd3,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x2;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_01,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {2} )","-2.0",dVar6,-2.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd4,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x0;
  pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_02,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {0, 1} )","+10.0",dVar6,10.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd5,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x0;
  pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_03,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {0, 2} )","-20.0",dVar6,-20.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd6,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x1;
  pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_04,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {1, 2} )","+21.0",dVar6,21.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd7,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_13b8 = (undefined1  [8])0x0;
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_13a8 = (pointer)0x2;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)local_13b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_05,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2878,"poly_graph.J({0, 1, 2})","-120.0",dVar6,-120.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_2878[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_2870 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_2870->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd8,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_13b8,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_13b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_2870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2870,pbStack_2870);
  }
  local_2878 = (undefined1  [8])0x1;
  pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_06,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {1, 0} )","+10.0",dVar6,10.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xda,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x2;
  pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_07,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {2, 0} )","-20.0",dVar6,-20.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdb,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_2878 = (undefined1  [8])0x2;
  pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)local_2878;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_08,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_13b8,"poly_graph.J( {2, 1} )","+21.0",dVar6,21.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_13b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_13b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_13b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdc,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_13b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_13b0,pbStack_13b0);
  }
  local_13b8 = (undefined1  [8])0x0;
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_13a8 = (pointer)0x1;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_13b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_09,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2878,"poly_graph.J({0, 2, 1})","-120.0",dVar6,-120.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_2878[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_2870 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_2870->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdd,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_13b8,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_13b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_2870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2870,pbStack_2870);
  }
  local_13b8 = (undefined1  [8])0x1;
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_13a8 = (pointer)0x0;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)local_13b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_10,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2878,"poly_graph.J({1, 2, 0})","-120.0",dVar6,-120.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_2878[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_2870 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_2870->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xde,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_13b8,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_13b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_2870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2870,pbStack_2870);
  }
  local_13b8 = (undefined1  [8])0x1;
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_13a8 = (pointer)0x2;
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)local_13b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_11,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2878,"poly_graph.J({1, 0, 2})","-120.0",dVar6,-120.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_2878[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_2870 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_2870->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdf,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_13b8,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_13b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_2870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2870,pbStack_2870);
  }
  local_13b8 = (undefined1  [8])0x2;
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_13a8 = (pointer)0x0;
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)local_13b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_12,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2878,"poly_graph.J({2, 1, 0})","-120.0",dVar6,-120.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_2878[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_2870 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_2870->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe0,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_13b8,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_13b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_2870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2870,pbStack_2870);
  }
  local_13b8 = (undefined1  [8])0x2;
  pbStack_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_13a8 = (pointer)0x1;
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)local_13b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748,__l_13,
             (allocator_type *)&local_2858);
  dVar6 = openjij::graph::Polynomial<double>::J
                    (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2748)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2878,"poly_graph.J({2, 0, 1})","-120.0",dVar6,-120.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ - local_2748._0_8_);
  }
  if (local_2878[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2748);
    if (pbStack_2870 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_2870->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe1,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_13b8,(Message *)local_2748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_13b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(unsigned_long *)local_2748._0_8_ + 8))();
    }
  }
  if (pbStack_2870 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2870,pbStack_2870);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<>(poly_graph);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( )","+0.1",dVar6,0.1);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe3,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int>(poly_graph,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 0 )","-0.5",dVar6,-0.5);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe4,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_13b8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int>(poly_graph,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 1 )","+1.0",dVar6,1.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe5,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_13b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int>(poly_graph,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 2 )","-2.0",dVar6,-2.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe6,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 0, 1 )","+10.0",dVar6,10.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe7,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 0, 2 )","-20.0",dVar6,-20.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe8,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 1, 2 )","+21.0",dVar6,21.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe9,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_13b8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,1,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J(0, 1, 2)","-120.0",dVar6,-120.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xea,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_13b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 1, 0 )","+10.0",dVar6,10.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xec,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,2,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 2, 0 )","-20.0",dVar6,-20.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xed,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,2,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J( 2, 1 )","+21.0",dVar6,21.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xee,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,2,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J(0, 2, 1)","-120.0",dVar6,-120.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xef,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_13b8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,1,2,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J(1, 2, 0)","-120.0",dVar6,-120.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf0,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_13b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,1,0,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J(1, 0, 2)","-120.0",dVar6,-120.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf1,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,2,1,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J(2, 1, 0)","-120.0",dVar6,-120.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf2,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  dVar6 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,2,0,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2748,"poly_graph.J(2, 0, 1)","-120.0",dVar6,-120.0);
  if ((internal)local_2748[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_13b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_2748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf3,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
    if (local_13b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_13b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2748._8_8_);
  }
  local_2738._0_8_ = (pointer)0x0;
  local_2738._8_8_ = 0;
  local_2748._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_2748._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738;
  bVar7 = testing::internal::AlwaysTrue();
  if (bVar7) {
    openjij::graph::Polynomial<double>::J<int>(poly_graph,500);
  }
  std::__cxx11::string::_M_replace((ulong)local_2748,0,(char *)local_2748._8_8_,0x1eb408);
  testing::Message::Message((Message *)local_13b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2878,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf5,(char *)local_2748._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_13b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    (**(code **)(*(long *)local_13b8 + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ + 1);
  }
  local_2738._0_8_ = (pointer)0x0;
  local_2738._8_8_ = 0;
  local_2748._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_2748._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738;
  bVar7 = testing::internal::AlwaysTrue();
  if (bVar7) {
    openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,0);
  }
  std::__cxx11::string::_M_replace((ulong)local_2748,0,(char *)local_2748._8_8_,0x1eb54c);
  testing::Message::Message((Message *)local_13b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2878,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf6,(char *)local_2748._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
  if (local_13b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_13b8 + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ + 1);
  }
  local_2738._0_8_ = (pointer)0x0;
  local_2738._8_8_ = 0;
  local_2748._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_2748._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738;
  bVar7 = testing::internal::AlwaysTrue();
  if (bVar7) {
    openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,2,1,1);
  }
  std::__cxx11::string::_M_replace((ulong)local_2748,0,(char *)local_2748._8_8_,0x1eb693);
  testing::Message::Message((Message *)local_13b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2878,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf7,(char *)local_2748._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
  if (local_13b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_13b8 + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ + 1);
  }
  local_2738._0_8_ = (pointer)0x0;
  local_2738._8_8_ = 0;
  local_2748._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_2748._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738;
  bVar7 = testing::internal::AlwaysTrue();
  if (bVar7) {
    local_2878 = (undefined1  [8])0x1f4;
    __l_14._M_len = 1;
    __l_14._M_array = (iterator)local_2878;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13b8,__l_14,
               (allocator_type *)&local_2858);
    openjij::graph::Polynomial<double>::J
              (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13b8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_13b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      operator_delete((void *)local_13b8,(long)local_13a8 - (long)local_13b8);
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_2748,0,(char *)local_2748._8_8_,0x1eb7db);
  testing::Message::Message((Message *)local_13b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2878,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf9,(char *)local_2748._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
  if (local_13b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_13b8 + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ + 1);
  }
  local_2738._0_8_ = (pointer)0x0;
  local_2738._8_8_ = 0;
  local_2748._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_2748._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738;
  bVar7 = testing::internal::AlwaysTrue();
  if (bVar7) {
    local_2878 = (undefined1  [8])0x0;
    pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __l_15._M_len = 2;
    __l_15._M_array = (iterator)local_2878;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13b8,__l_15,
               (allocator_type *)&local_2858);
    openjij::graph::Polynomial<double>::J
              (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13b8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_13b8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      operator_delete((void *)local_13b8,(long)local_13a8 - (long)local_13b8);
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_2748,0,(char *)local_2748._8_8_,0x1eb925);
  testing::Message::Message((Message *)local_13b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2878,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xfa,(char *)local_2748._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
  if (local_13b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_13b8 + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ + 1);
  }
  local_2738._0_8_ = (pointer)0x0;
  local_2738._8_8_ = 0;
  local_2748._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_2748._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738;
  bVar7 = testing::internal::AlwaysTrue();
  if (bVar7) {
    local_2878 = (undefined1  [8])0x2;
    pbStack_2870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_2868 = (pointer)0x1;
    __l_16._M_len = 3;
    __l_16._M_array = (iterator)local_2878;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13b8,__l_16,
               (allocator_type *)&local_2858);
    openjij::graph::Polynomial<double>::J
              (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13b8);
    if (local_13b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_13b8,(long)local_13a8 - (long)local_13b8);
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_2748,0,(char *)local_2748._8_8_,0x1eba72);
  testing::Message::Message((Message *)local_13b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2878,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xfb,(char *)local_2748._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2878,(Message *)local_13b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2878);
  if (local_13b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_13b8 + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2738) {
    operator_delete((void *)local_2748._0_8_,local_2738._0_8_ + 1);
  }
  std::random_device::random_device((random_device *)local_2748);
  local_13b8._0_4_ = std::random_device::_M_getval();
  local_13b8._4_4_ = 0;
  lVar9 = 1;
  _Var8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_13b8;
  do {
    _Var8._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         ((uint)((ulong)_Var8._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl >> 0x1e) ^
         (uint)_Var8._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl) * 0x6c078965 + (int)lVar9;
    _Var8._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
    ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      *)(local_13b8 + lVar9 * 8))->
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         = (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )_Var8._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_38 = 0x270;
  openjij::graph::Graph::
  gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((Spins *)local_2878,&poly_graph->super_Graph,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13b8);
  openjij::graph::Graph::
  gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (&local_2858,&poly_graph->super_Graph,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13b8);
  local_2750 = openjij::graph::Polynomial<double>::J<>(poly_graph);
  local_27d4 = *(Type *)local_2878;
  local_2758 = openjij::graph::Polynomial<double>::J<int>(poly_graph,0);
  local_27d8 = *(int *)((long)local_2878 + 4);
  local_2760 = openjij::graph::Polynomial<double>::J<int>(poly_graph,1);
  local_27dc = *(int *)((long)local_2878 + 8);
  local_2768 = openjij::graph::Polynomial<double>::J<int>(poly_graph,2);
  local_27e0 = *(Type *)local_2878;
  iVar1 = *(int *)((long)local_2878 + 4);
  local_2770 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,1);
  local_27e4 = *(Type *)local_2878;
  iVar2 = *(int *)((long)local_2878 + 8);
  local_2778 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,2);
  local_27e8 = *(int *)((long)local_2878 + 4);
  iVar3 = *(int *)((long)local_2878 + 8);
  local_2780 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,2);
  local_27ec = *(Type *)local_2878;
  iVar4 = *(int *)((long)local_2878 + 4);
  local_27f0 = *(int *)((long)local_2878 + 8);
  local_2788 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,1,2);
  local_2790 = openjij::graph::Polynomial<double>::J<>(poly_graph);
  local_27f4 = *local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_2798 = openjij::graph::Polynomial<double>::J<int>(poly_graph,0);
  local_27f8 = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
  local_27a0 = openjij::graph::Polynomial<double>::J<int>(poly_graph,1);
  local_27fc = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[2];
  local_27a8 = openjij::graph::Polynomial<double>::J<int>(poly_graph,2);
  local_2804 = *local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_2800 = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
  local_27b0 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,1);
  local_280c = *local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_2808 = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[2];
  local_27b8 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,2);
  local_2814 = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
  local_2810 = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[2];
  local_27c0 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,2);
  local_2818 = *local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar5 = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
  local_281c = local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[2];
  local_27d0 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,1,2);
  local_27c8 = poly_graph;
  dVar6 = openjij::graph::Polynomial<double>::energy(poly_graph,(Spins *)local_2878,true);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_2830,"poly_graph.energy(spins)","energy_spins",dVar6,
             (double)(int)(iVar4 * local_27ec * local_27f0) * local_2788 +
             (double)(iVar3 * local_27e8) * local_2780 +
             (double)(int)(iVar2 * local_27e4) * local_2778 +
             (double)(int)(iVar1 * local_27e0) * local_2770 +
             (double)local_27dc * local_2768 +
             (double)local_27d8 * local_2760 +
             (double)(int)local_27d4 * local_2758 + local_2750 + 0.0);
  if (local_2830[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2838);
    if (local_2828 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_2828->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0x117,pcVar10);
    testing::internal::AssertHelper::operator=(&local_2840,(Message *)&local_2838);
    testing::internal::AssertHelper::~AssertHelper(&local_2840);
    if (local_2838._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2838._M_head_impl + 8))();
    }
  }
  if (local_2828 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2828,local_2828);
  }
  dVar6 = openjij::graph::Polynomial<double>::energy(local_27c8,&local_2858,true);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_2830,"poly_graph.energy(binaries)","energy_binaries",dVar6,
             (double)(iVar5 * local_2818 * local_281c) * local_27d0 +
             (double)(local_2810 * local_2814) * local_27c0 +
             (double)(local_2808 * local_280c) * local_27b8 +
             (double)(local_2800 * local_2804) * local_27b0 +
             (double)local_27fc * local_27a8 +
             (double)local_27f8 * local_27a0 + (double)local_27f4 * local_2798 + local_2790 + 0.0);
  if (local_2830[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2838);
    if (local_2828 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_2828->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0x118,pcVar10);
    testing::internal::AssertHelper::operator=(&local_2840,(Message *)&local_2838);
    testing::internal::AssertHelper::~AssertHelper(&local_2840);
    if (local_2838._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2838._M_head_impl + 8))();
    }
  }
  if (local_2828 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2828,local_2828);
  }
  if (local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2878 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2878,(long)local_2868 - (long)local_2878);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void TestPolyGraphDense(const openjij::graph::Polynomial<FloatType> &poly_graph) {
   EXPECT_EQ(poly_graph.size()                , 3);
   EXPECT_EQ(poly_graph.get_num_interactions(), 8);
   EXPECT_EQ(poly_graph.get_values().size()   , 8);
   EXPECT_EQ(poly_graph.get_keys().size()     , 8);
   
   EXPECT_DOUBLE_EQ(poly_graph.J(   {}    ), +0.1  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   {0}   ), -0.5  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   {1}   ), +1.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   {2}   ), -2.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J( {0, 1}  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {0, 2}  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {1, 2}  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J({0, 1, 2}), -120.0);
   
   EXPECT_DOUBLE_EQ(poly_graph.J( {1, 0}  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {2, 0}  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {2, 1}  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J({0, 2, 1}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({1, 2, 0}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({1, 0, 2}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({2, 1, 0}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({2, 0, 1}), -120.0);
   
   EXPECT_DOUBLE_EQ(poly_graph.J(       ), +0.1  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   0   ), -0.5  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   1   ), +1.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   2   ), -2.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J( 0, 1  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 0, 2  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 1, 2  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J(0, 1, 2), -120.0);
   
   EXPECT_DOUBLE_EQ(poly_graph.J( 1, 0  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 2, 0  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 2, 1  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J(0, 2, 1), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(1, 2, 0), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(1, 0, 2), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(2, 1, 0), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(2, 0, 1), -120.0);
   
   EXPECT_THROW(poly_graph.J(  500  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J( 0, 0  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J(2, 1, 1), std::runtime_error);
   
   EXPECT_THROW(poly_graph.J(  {500}  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J( {0, 0}  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J({2, 1, 1}), std::runtime_error);
   
   std::random_device rnd;
   std::mt19937 mt(rnd());
   const auto spins    = poly_graph.gen_spin(mt);
   const auto binaries = poly_graph.gen_binary(mt);
   
   FloatType energy_spins    = 0.0;
   FloatType energy_binaries = 0.0;

   energy_spins += poly_graph.J();
   energy_spins += spins[0]*poly_graph.J(0);
   energy_spins += spins[1]*poly_graph.J(1);
   energy_spins += spins[2]*poly_graph.J(2);
   energy_spins += spins[0]*spins[1]*poly_graph.J(0,1);
   energy_spins += spins[0]*spins[2]*poly_graph.J(0,2);
   energy_spins += spins[1]*spins[2]*poly_graph.J(1,2);
   energy_spins += spins[0]*spins[1]*spins[2]*poly_graph.J(0,1,2);
   
   energy_binaries += poly_graph.J();
   energy_binaries += binaries[0]*poly_graph.J(0);
   energy_binaries += binaries[1]*poly_graph.J(1);
   energy_binaries += binaries[2]*poly_graph.J(2);
   energy_binaries += binaries[0]*binaries[1]*poly_graph.J(0,1);
   energy_binaries += binaries[0]*binaries[2]*poly_graph.J(0,2);
   energy_binaries += binaries[1]*binaries[2]*poly_graph.J(1,2);
   energy_binaries += binaries[0]*binaries[1]*binaries[2]*poly_graph.J(0,1,2);
   
   EXPECT_DOUBLE_EQ(poly_graph.energy(spins)   , energy_spins);
   EXPECT_DOUBLE_EQ(poly_graph.energy(binaries), energy_binaries);

}